

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

Real __thiscall COLLADABU::Math::Quaternion::normalise(Quaternion *this)

{
  Quaternion *in_RDI;
  Real __x;
  Real factor;
  Real len;
  Quaternion *in_stack_ffffffffffffffc8;
  
  __x = norm(in_RDI);
  sqrt(__x);
  operator*(in_stack_ffffffffffffffc8,(Real)in_RDI);
  operator=(in_RDI,(Quaternion *)&stack0xffffffffffffffc8);
  return __x;
}

Assistant:

Real Quaternion::normalise( void )
        {
            Real len = norm();
            Real factor = 1.0f / sqrt( len );
            *this = *this * factor;
            return len;
        }